

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
slice_projection::evaluate
          (slice_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  bool bVar1;
  reference this_00;
  int64_t iVar2;
  size_t sVar3;
  reference args_1;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *peVar4;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI;
  reference j_1;
  int64_t i_1;
  reference j;
  int64_t i;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  int64_t step;
  int64_t end;
  int64_t start;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_01;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  error_code *ec_00;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  json_const_pointer_arg_t *local_68;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **in_stack_ffffffffffffffa8;
  json_const_pointer_arg_t *in_stack_ffffffffffffffb0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_38;
  json_const_pointer_arg_t *local_30;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *i_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffff8;
  
  i_00 = in_RDI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    (in_stack_ffffffffffffff78);
  if (bVar1) {
    peVar4 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)&(in_RDI->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff68);
    local_30 = (json_const_pointer_arg_t *)
               slice::get_start((slice *)in_stack_ffffffffffffff88,(size_t)in_RDI);
    ec_00 = (error_code *)&(in_RDI->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff68);
    local_38 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               slice::get_stop((slice *)in_stack_ffffffffffffff88,(size_t)in_RDI);
    iVar2 = slice::step((slice *)&(in_RDI->variables_)._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
    if (iVar2 == 0) {
      std::error_code::operator=
                ((error_code *)peVar4,(jmespath_errc)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      this_00 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::null_value(peVar4);
    }
    else {
      this_00 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ::create_json<jsoncons::json_array_arg_t_const&>
                          (in_stack_ffffffffffffff90,(json_array_arg_t *)in_stack_ffffffffffffff88);
      if (iVar2 < 1) {
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          (in_stack_ffffffffffffff68);
        if ((long)sVar3 <= (long)local_30) {
          sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            (in_stack_ffffffffffffff68);
          local_30 = (json_const_pointer_arg_t *)(sVar3 - 1);
        }
        if ((long)local_38 < -1) {
          local_38 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     0xffffffffffffffff;
        }
        for (local_68 = local_30; (long)local_38 < (long)local_68; local_68 = local_68 + iVar2) {
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                    (in_stack_fffffffffffffff8,(size_t)i_00);
          peVar4 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)projection_base::apply_expressions
                                ((projection_base *)in_stack_ffffffffffffff90,
                                 (reference)in_stack_ffffffffffffff88,in_RDI,ec_00);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             ec_00);
          in_stack_ffffffffffffff90 = peVar4;
          if (!bVar1) {
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            in_stack_ffffffffffffff88 = peVar4;
          }
        }
      }
      else {
        if ((long)local_30 < 0) {
          local_30 = (json_const_pointer_arg_t *)0x0;
        }
        this_01 = local_38;
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(local_38);
        if ((long)sVar3 < (long)this_01) {
          local_38 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_01)
          ;
        }
        for (; (long)local_30 < (long)local_38; local_30 = local_30 + iVar2) {
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                    (in_stack_fffffffffffffff8,(size_t)i_00);
          args_1 = projection_base::apply_expressions
                             ((projection_base *)in_stack_ffffffffffffff90,
                              (reference)in_stack_ffffffffffffff88,in_RDI,ec_00);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             ec_00);
          if (!bVar1) {
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,local_30,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)args_1);
          }
        }
      }
    }
  }
  else {
    this_00 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::null_value(in_stack_ffffffffffffff70);
  }
  return this_00;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto start = slice_.get_start(val.size());
                auto end = slice_.get_stop(val.size());
                auto step = slice_.step();

                if (step == 0)
                {
                    ec = jmespath_errc::step_cannot_be_zero;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(val.size()))
                    {
                        end = val.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }
                else
                {
                    if (start >= static_cast<int64_t>(val.size()))
                    {
                        start = static_cast<int64_t>(val.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }

                return *result;
            }